

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void cleanup_regions(REGIONS *regions,int *num_regions)

{
  int *in_RSI;
  int *in_RDI;
  int k;
  int *unaff_retaddr;
  int local_14;
  
  local_14 = 0;
  while (local_14 < *in_RSI) {
    if ((((local_14 < 1) ||
         (in_RDI[(long)(local_14 + -1) * 0xe + 0xc] != in_RDI[(long)local_14 * 0xe + 0xc])) ||
        (in_RDI[(long)local_14 * 0xe + 0xc] == 2)) &&
       (in_RDI[(long)local_14 * 0xe] <= in_RDI[(long)local_14 * 0xe + 1])) {
      local_14 = local_14 + 1;
    }
    else {
      remove_region(regions._4_4_,(REGIONS *)num_regions,unaff_retaddr,in_RDI);
    }
  }
  return;
}

Assistant:

static void cleanup_regions(REGIONS *regions, int *num_regions) {
  int k = 0;
  while (k < *num_regions) {
    if ((k > 0 && regions[k - 1].type == regions[k].type &&
         regions[k].type != SCENECUT_REGION) ||
        regions[k].last < regions[k].start) {
      remove_region(0, regions, num_regions, &k);
    } else {
      k++;
    }
  }
}